

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O3

string * __thiscall
lest::to_string<std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,lest *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,string *op,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  long *plVar1;
  ostream *poVar2;
  ulong *puVar3;
  ostringstream os;
  ulong local_218;
  long lStack_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8;
  long lStack_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  long lStack_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator+(&local_208,"\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_208);
  local_1c8 = (ulong *)*plVar1;
  puVar3 = (ulong *)(plVar1 + 2);
  if (local_1c8 == puVar3) {
    local_218 = *puVar3;
    lStack_210 = plVar1[3];
    local_1c0 = plVar1[1];
    *plVar1 = (long)puVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
LAB_0014313e:
    local_1c8 = &local_1b8;
    lStack_1b0 = lStack_210;
  }
  else {
    local_218 = plVar1[2];
    local_1c0 = plVar1[1];
    *plVar1 = (long)puVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_1c8 == &local_218) goto LAB_0014313e;
  }
  local_1b8 = local_218;
  local_218 = local_218 & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(lhs->_M_dataplus)._M_p,lhs->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::operator+(&local_208,"\"",op);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_208);
  local_1e8 = (ulong *)*plVar1;
  puVar3 = (ulong *)(plVar1 + 2);
  if (local_1e8 == puVar3) {
    local_218 = *puVar3;
    lStack_210 = plVar1[3];
    local_1e0 = plVar1[1];
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
  }
  else {
    local_218 = plVar1[2];
    local_1e0 = plVar1[1];
    *plVar1 = (long)puVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_1e8 != &local_218) goto LAB_0014326a;
  }
  local_1e8 = &local_1d8;
  lStack_1d0 = lStack_210;
LAB_0014326a:
  local_1d8 = local_218;
  local_218 = local_218 & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1e8,local_1e0);
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  std::__cxx11::stringbuf::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_218;
  *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lStack_210;
  __return_storage_ptr__->_M_string_length = 0;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}